

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void phys_sections_free(PhysPageMap *map)

{
  uint uVar1;
  MemoryRegionSection *section;
  PhysPageMap *map_local;
  
  while (map->sections_nb != 0) {
    uVar1 = map->sections_nb - 1;
    map->sections_nb = uVar1;
    phys_section_destroy((MemoryRegion_conflict *)map->sections[uVar1].mr);
  }
  g_free(map->sections);
  g_free(map->nodes);
  return;
}

Assistant:

static void phys_sections_free(PhysPageMap *map)
{
    while (map->sections_nb > 0) {
        MemoryRegionSection *section = &map->sections[--map->sections_nb];
        phys_section_destroy(section->mr);
    }
    g_free(map->sections);
    g_free(map->nodes);
}